

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

void parse_output_model(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  ostream *poVar3;
  option_group_definition output_model_options;
  undefined1 *local_e28 [2];
  undefined1 local_e18 [16];
  string local_e08;
  undefined1 *local_de8 [2];
  undefined1 local_dd8 [16];
  undefined1 *local_dc8 [2];
  undefined1 local_db8 [16];
  string local_da8;
  undefined1 *local_d88 [2];
  undefined1 local_d78 [16];
  string local_d68;
  undefined1 *local_d48 [2];
  undefined1 local_d38 [16];
  string local_d28;
  undefined1 *local_d08 [2];
  undefined1 local_cf8 [16];
  string local_ce8;
  undefined1 *local_cc8 [2];
  undefined1 local_cb8 [16];
  string local_ca8;
  undefined1 *local_c88 [2];
  undefined1 local_c78 [16];
  undefined1 *local_c68 [2];
  undefined1 local_c58 [16];
  string local_c48;
  option_group_definition local_c28;
  undefined1 *local_bf0 [2];
  undefined1 local_be0 [16];
  string local_bd0;
  string local_bb0;
  undefined1 *local_b90;
  long local_b88;
  undefined1 local_b80 [16];
  undefined1 local_b70 [80];
  string local_b20 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ae8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ad8;
  undefined1 local_ad0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a38;
  undefined1 local_a30 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_998;
  undefined1 local_990 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  undefined1 local_8f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  undefined1 local_850 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b8;
  undefined1 local_7b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_718;
  undefined1 local_710 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_678;
  undefined1 local_670 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_530;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  typed_option<bool> local_3f0;
  typed_option<bool> local_350;
  typed_option<bool> local_2b0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  local_b90 = local_b80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b90,"Output model","");
  local_c28.m_name._M_dataplus._M_p = (pointer)&local_c28.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c28,local_b90,local_b90 + local_b88);
  local_c28.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c28.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c28.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_b90 != local_b80) {
    operator_delete(local_b90);
  }
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c48,"final_regressor","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b70,&local_c48,&all->final_regressor_name);
  local_c68[0] = local_c58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c68,"f","");
  std::__cxx11::string::_M_assign(local_b20);
  local_c88[0] = local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"Final regressor","");
  std::__cxx11::string::_M_assign((string *)(local_b70 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b70);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(&local_c28,&local_d0);
  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"readable_model","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_670,&local_ca8,&all->text_regressor_name);
  local_cc8[0] = local_cb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc8,"Output human-readable final regressor with numeric features","");
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_670);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_170);
  local_ce8._M_dataplus._M_p = (pointer)&local_ce8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce8,"invert_hash","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_710,&local_ce8,&all->inv_hash_regressor_name);
  local_d08[0] = local_cf8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d08,
             "Output human-readable final regressor with feature names.  Computationally expensive."
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_210,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_710);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_210);
  local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"save_resume","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_7b0,&local_d28,&all->save_resume);
  local_d48[0] = local_d38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d48,"save extra state so learning can be resumed later with new data",
             "");
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_7b0);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_2b0);
  local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d68,"preserve_performance_counters","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_850,&local_d68,&all->preserve_performance_counters);
  local_d88[0] = local_d78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d88,"reset performance counters when warmstarting","");
  std::__cxx11::string::_M_assign((string *)(local_850 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_350,(typed_option<bool> *)local_850);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_350);
  local_da8._M_dataplus._M_p = (pointer)&local_da8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_da8,"save_per_pass","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_8f0,&local_da8,&all->save_per_pass);
  local_dc8[0] = local_db8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dc8,"Save the model after every pass over data","");
  std::__cxx11::string::_M_assign((string *)(local_8f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_3f0,(typed_option<bool> *)local_8f0);
  poVar2 = VW::config::option_group_definition::add<bool>(poVar2,&local_3f0);
  local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bb0,"output_feature_regularizer_binary","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990,&local_bb0,&all->per_feature_regularizer_output);
  local_de8[0] = local_dd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_de8,"Per feature regularization output file","");
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_490,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_490);
  local_e08._M_dataplus._M_p = (pointer)&local_e08.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e08,"output_feature_regularizer_text","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a30,&local_e08,&all->per_feature_regularizer_text);
  local_e28[0] = local_e18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e28,"Per feature regularization output file, in text","");
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_530,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a30);
  poVar2 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_530);
  local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd0,"id","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_ad0,&local_bd0,&all->id);
  local_bf0[0] = local_be0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bf0,"User supplied ID embedded into the final regressor","");
  std::__cxx11::string::_M_assign((string *)(local_ad0 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_5d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_ad0);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_5d0);
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cedc0;
  if (local_5d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_bf0[0] != local_be0) {
    operator_delete(local_bf0[0]);
  }
  local_ad0._0_8_ = &PTR__typed_option_002cedc0;
  if (local_a38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a38._M_pi);
  }
  if (local_a48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
    operator_delete(local_bd0._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cedc0;
  if (local_530.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_530.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_e28[0] != local_e18) {
    operator_delete(local_e28[0]);
  }
  local_a30._0_8_ = &PTR__typed_option_002cedc0;
  if (local_998._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_998._M_pi);
  }
  if (local_9a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08._M_dataplus._M_p != &local_e08.field_2) {
    operator_delete(local_e08._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cedc0;
  if (local_490.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_490.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_de8[0] != local_dd8) {
    operator_delete(local_de8[0]);
  }
  local_990._0_8_ = &PTR__typed_option_002cedc0;
  if (local_8f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8f8._M_pi);
  }
  if (local_908._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_908._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
    operator_delete(local_bb0._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ccf10;
  if (local_3f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_dc8[0] != local_db8) {
    operator_delete(local_dc8[0]);
  }
  local_8f0._0_8_ = &PTR__typed_option_002ccf10;
  if (local_858._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_858._M_pi);
  }
  if (local_868._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_868._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_da8._M_dataplus._M_p != &local_da8.field_2) {
    operator_delete(local_da8._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ccf10;
  if (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_d88[0] != local_d78) {
    operator_delete(local_d88[0]);
  }
  local_850._0_8_ = &PTR__typed_option_002ccf10;
  if (local_7b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b8._M_pi);
  }
  if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_850);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
    operator_delete(local_d68._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ccf10;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_d48[0] != local_d38) {
    operator_delete(local_d48[0]);
  }
  local_7b0._0_8_ = &PTR__typed_option_002ccf10;
  if (local_718._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_718._M_pi);
  }
  if (local_728._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_728._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
    operator_delete(local_d28._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cedc0;
  if (local_210.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_d08[0] != local_cf8) {
    operator_delete(local_d08[0]);
  }
  local_710._0_8_ = &PTR__typed_option_002cedc0;
  if (local_678._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_678._M_pi);
  }
  if (local_688._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_688._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
    operator_delete(local_ce8._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cedc0;
  if (local_170.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_cc8[0] != local_cb8) {
    operator_delete(local_cc8[0]);
  }
  local_670._0_8_ = &PTR__typed_option_002cedc0;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
    operator_delete(local_ca8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cedc0;
  if (local_d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_c88[0] != local_c78) {
    operator_delete(local_c88[0]);
  }
  if (local_c68[0] != local_c58) {
    operator_delete(local_c68[0]);
  }
  local_b70._0_8_ = &PTR__typed_option_002cedc0;
  if (local_ad8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ad8._M_pi);
  }
  if (local_ae8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ae8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_b70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_c28);
  iVar1 = std::__cxx11::string::compare((char *)&all->final_regressor_name);
  if ((iVar1 != 0) && (all->quiet == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,"final_regressor = ",0x12);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (&(all->trace_message).super_ostream,
                        (all->final_regressor_name)._M_dataplus._M_p,
                        (all->final_regressor_name)._M_string_length);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  local_b70._0_8_ = local_b70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b70,"invert_hash","");
  iVar1 = (*options->_vptr_options_i[1])(options,local_b70);
  if ((undefined1 *)local_b70._0_8_ != local_b70 + 0x10) {
    operator_delete((void *)local_b70._0_8_);
  }
  if ((char)iVar1 != '\0') {
    all->hash_inv = true;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_c28.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28.m_name._M_dataplus._M_p != &local_c28.m_name.field_2) {
    operator_delete(local_c28.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void parse_output_model(options_i& options, vw& all)
{
  option_group_definition output_model_options("Output model");
  output_model_options
      .add(make_option("final_regressor", all.final_regressor_name).short_name("f").help("Final regressor"))
      .add(make_option("readable_model", all.text_regressor_name)
               .help("Output human-readable final regressor with numeric features"))
      .add(make_option("invert_hash", all.inv_hash_regressor_name)
               .help("Output human-readable final regressor with feature names.  Computationally expensive."))
      .add(make_option("save_resume", all.save_resume)
               .help("save extra state so learning can be resumed later with new data"))
      .add(make_option("preserve_performance_counters", all.preserve_performance_counters)
               .help("reset performance counters when warmstarting"))
      .add(make_option("save_per_pass", all.save_per_pass).help("Save the model after every pass over data"))
      .add(make_option("output_feature_regularizer_binary", all.per_feature_regularizer_output)
               .help("Per feature regularization output file"))
      .add(make_option("output_feature_regularizer_text", all.per_feature_regularizer_text)
               .help("Per feature regularization output file, in text"))
      .add(make_option("id", all.id).help("User supplied ID embedded into the final regressor"));
  options.add_and_parse(output_model_options);

  if (all.final_regressor_name.compare("") && !all.quiet)
    all.trace_message << "final_regressor = " << all.final_regressor_name << endl;

  if (options.was_supplied("invert_hash"))
    all.hash_inv = true;

  // Question: This doesn't seem necessary
  // if (options.was_supplied("id") && find(arg.args.begin(), arg.args.end(), "--id") == arg.args.end())
  // {
  //   arg.args.push_back("--id");
  //   arg.args.push_back(arg.vm["id"].as<string>());
  // }
}